

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_ProfiledGetSuperProperty<Js::OpLayoutT_ElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>const__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  unsigned_short localRegisterID;
  ushort uVar1;
  PropertyId propertyId;
  Var pvVar2;
  InlineCache *inlineCache;
  FunctionBody *functionBody;
  Var thisInstance;
  OpLayoutT_ElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  localRegisterID = playout->Value;
  pvVar2 = GetReg<unsigned_short>(this,playout->Instance);
  propertyId = GetPropertyIdFromCacheId(this,(uint)playout->PropertyIdIndex);
  inlineCache = GetInlineCache(this,(uint)playout->PropertyIdIndex);
  uVar1 = playout->PropertyIdIndex;
  functionBody = GetFunctionBody(this);
  thisInstance = GetReg<unsigned_short>(this,playout->Value2);
  pvVar2 = ProfilingHelpers::ProfiledLdFld<false,false,false>
                     (pvVar2,propertyId,inlineCache,(uint)uVar1,functionBody,thisInstance);
  SetReg<unsigned_short>(this,localRegisterID,pvVar2);
  return;
}

Assistant:

void InterpreterStackFrame::OP_ProfiledGetSuperProperty(unaligned T* playout)
    {
        SetReg(
            playout->Value,
            ProfilingHelpers::ProfiledLdFld<false, false, false>(
                GetReg(playout->Instance),
                GetPropertyIdFromCacheId(playout->PropertyIdIndex),
                GetInlineCache(playout->PropertyIdIndex),
                playout->PropertyIdIndex,
                GetFunctionBody(),
                GetReg(playout->Value2)));

    }